

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O1

void andres::marray_detail::
     AssignmentOperatorHelper<true,_int,_int,_std::allocator<unsigned_long>,_std::allocator<unsigned_long>_>
     ::execute<false>(View<int,_false,_std::allocator<unsigned_long>_> *from,
                     View<int,_true,_std::allocator<unsigned_long>_> *to)

{
  size_t sVar1;
  unsigned_long *puVar2;
  
  to->data_ = from->data_;
  if (from != (View<int,_false,_std::allocator<unsigned_long>_> *)to) {
    sVar1 = (to->geometry_).dimension_;
    if ((from->geometry_).dimension_ != sVar1) {
      operator_delete((to->geometry_).shape_,sVar1 * 0x18);
      sVar1 = (from->geometry_).dimension_;
      (to->geometry_).dimension_ = sVar1;
      puVar2 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                         ((new_allocator<unsigned_long> *)&to->geometry_,sVar1 * 3,(void *)0x0);
      (to->geometry_).shape_ = puVar2;
      sVar1 = (to->geometry_).dimension_;
      (to->geometry_).shapeStrides_ = puVar2 + sVar1;
      (to->geometry_).strides_ = puVar2 + sVar1 + sVar1;
      (to->geometry_).dimension_ = (from->geometry_).dimension_;
    }
    memcpy((to->geometry_).shape_,(from->geometry_).shape_,(to->geometry_).dimension_ * 0x18);
    (to->geometry_).size_ = (from->geometry_).size_;
    (to->geometry_).coordinateOrder_ = (from->geometry_).coordinateOrder_;
    (to->geometry_).isSimple_ = (from->geometry_).isSimple_;
  }
  return;
}

Assistant:

static void execute
    (
        const View<TFrom, isConstFrom, AFrom>& from,
        View<TTo, true, ATo>& to
    )
    {
        Assert(MARRAY_NO_ARG_TEST || sizeof(TFrom) == sizeof(TTo));
        to.data_ = static_cast<const TTo*>(
            static_cast<const void*>(from.data_)); // copy pointer
        to.geometry_ = from.geometry_;
    }